

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O1

void __thiscall Fl_Help_View::free_data(Fl_Help_View *this)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int H;
  Fl_Help_View *__ptr;
  char *pcVar4;
  Fl_Help_View *pFVar5;
  Fl_Shared_Image *this_00;
  long lVar6;
  Fl_Help_View *this_01;
  int iVar7;
  char *pcVar8;
  long lVar9;
  char hattr [1024];
  char wattr [1024];
  char attr [1024];
  char local_c38 [1024];
  char local_838 [1024];
  char local_438 [1032];
  
  pcVar8 = this->value_;
  if (pcVar8 != (char *)0x0) {
    __ptr = (Fl_Help_View *)malloc(0x400);
    iVar7 = 0x400;
    do {
      while( true ) {
        for (; *pcVar8 != '<'; pcVar8 = pcVar8 + 1) {
          if (*pcVar8 == '\0') goto LAB_001b646b;
        }
        iVar3 = strncmp(pcVar8 + 1,"!--",3);
        if (iVar3 == 0) break;
        lVar9 = 1;
        lVar6 = 0;
        pFVar5 = __ptr;
        while( true ) {
          *(undefined1 *)&(__ptr->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = 0;
          bVar1 = pcVar8[lVar9];
          if (((bVar1 == 0) || (bVar1 == 0x3e)) || (iVar3 = isspace((uint)bVar1), iVar3 != 0))
          break;
          if (iVar7 <= (int)lVar9) {
            iVar7 = iVar7 + 0x400;
            pFVar5 = (Fl_Help_View *)realloc(pFVar5,(long)iVar7);
          }
          lVar6 = lVar6 + 1;
          *(byte *)((long)pFVar5 + lVar9 + -1) = bVar1;
          __ptr = (Fl_Help_View *)
                  ((long)&(pFVar5->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget + lVar6);
          lVar9 = lVar9 + 1;
        }
        pcVar4 = pcVar8 + lVar9;
        for (pcVar8 = pcVar4; (cVar2 = *pcVar8, cVar2 != '\0' && (cVar2 != '>'));
            pcVar8 = pcVar8 + 1) {
        }
        pcVar8 = pcVar8 + (cVar2 == '>');
        this_01 = pFVar5;
        iVar3 = strcasecmp((char *)pFVar5,"IMG");
        __ptr = pFVar5;
        if (iVar3 == 0) {
          get_attr(this_01,pcVar4,"WIDTH",local_838,0x400);
          get_attr(this_01,pcVar4,"HEIGHT",local_c38,0x400);
          iVar3 = get_length(this,local_838);
          pFVar5 = this;
          H = get_length(this,local_c38);
          pcVar4 = get_attr(pFVar5,pcVar4,"SRC",local_438,0x400);
          if ((pcVar4 != (char *)0x0) &&
             (this_00 = get_image(this,local_438,iVar3,H),
             this_00 != (Fl_Shared_Image *)&broken_image)) {
            Fl_Shared_Image::release(this_00);
          }
        }
      }
      pcVar4 = strstr(pcVar8 + 4,"-->");
      pcVar8 = pcVar4 + 3;
    } while (pcVar4 != (char *)0x0);
LAB_001b646b:
    free(this->value_);
    this->value_ = (char *)0x0;
    if (__ptr != (Fl_Help_View *)0x0) {
      free(__ptr);
    }
  }
  if (this->nblocks_ != 0) {
    free(this->blocks_);
    this->nblocks_ = 0;
    this->ablocks_ = 0;
    this->blocks_ = (Fl_Help_Block *)0x0;
  }
  if (this->nlinks_ != 0) {
    free(this->links_);
    this->nlinks_ = 0;
    this->alinks_ = 0;
    this->links_ = (Fl_Help_Link *)0x0;
  }
  if (this->ntargets_ != 0) {
    free(this->targets_);
    this->ntargets_ = 0;
    this->atargets_ = 0;
    this->targets_ = (Fl_Help_Target *)0x0;
  }
  return;
}

Assistant:

void
Fl_Help_View::free_data() {
  // Release all images...
  if (value_) {
    const char	*ptr,		// Pointer into block
		*attrs;		// Pointer to start of element attributes
    HV_Edit_Buffer buf;		// Text buffer
    char	attr[1024],	// Attribute buffer
		wattr[1024],	// Width attribute buffer
		hattr[1024];	// Height attribute buffer

    DEBUG_FUNCTION(__LINE__,__FUNCTION__);

    for (ptr = value_; *ptr;)
    {
      if (*ptr == '<')
      {
	ptr ++;

        if (strncmp(ptr, "!--", 3) == 0)
	{
	  // Comment...
	  ptr += 3;
	  if ((ptr = strstr(ptr, "-->")) != NULL)
	  {
	    ptr += 3;
	    continue;
	  }
	  else
	    break;
	}

        buf.clear();

	while (*ptr && *ptr != '>' && !isspace((*ptr)&255))
	  buf.add(*ptr++);

	attrs = ptr;
	while (*ptr && *ptr != '>')
          ptr ++;

	if (*ptr == '>')
          ptr ++;

	if (buf.cmp("IMG"))
	{
	  Fl_Shared_Image	*img;
	  int		width;
	  int		height;

          get_attr(attrs, "WIDTH", wattr, sizeof(wattr));
          get_attr(attrs, "HEIGHT", hattr, sizeof(hattr));
	  width  = get_length(wattr);
	  height = get_length(hattr);

	  if (get_attr(attrs, "SRC", attr, sizeof(attr))) {
	    // Get and release the image to free it from memory...
	    img = get_image(attr, width, height);
	    if ((void*)img != &broken_image) {
	      img->release();
	    }
	  }
	}
      }
      else
        ptr ++;
    }

    free((void *)value_);
    value_ = 0;
  }

  // Free all of the arrays...
  if (nblocks_) {
    free(blocks_);

    ablocks_ = 0;
    nblocks_ = 0;
    blocks_  = 0;
  }

  if (nlinks_) {
    free(links_);

    alinks_ = 0;
    nlinks_ = 0;
    links_  = 0;
  }

  if (ntargets_) {
    free(targets_);

    atargets_ = 0;
    ntargets_ = 0;
    targets_  = 0;
  }
}